

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver_types.hpp
# Opt level: O3

void __thiscall Satyricon::Literal_Heap::initialize(Literal_Heap *this)

{
  vector<Satyricon::Literal,_std::allocator<Satyricon::Literal>_> *this_00;
  ulong in_RAX;
  pointer piVar1;
  Literal *pLVar2;
  ulong uVar3;
  pointer pLVar4;
  int iVar5;
  iterator iVar6;
  ulong uVar7;
  size_type i;
  uint uVar8;
  bool bVar9;
  Literal l;
  undefined8 uStack_38;
  
  this_00 = &this->value;
  pLVar4 = (this->value).super__Vector_base<Satyricon::Literal,_std::allocator<Satyricon::Literal>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->value).super__Vector_base<Satyricon::Literal,_std::allocator<Satyricon::Literal>_>.
      _M_impl.super__Vector_impl_data._M_finish != pLVar4) {
    (this->value).super__Vector_base<Satyricon::Literal,_std::allocator<Satyricon::Literal>_>.
    _M_impl.super__Vector_impl_data._M_finish = pLVar4;
  }
  uStack_38 = in_RAX;
  std::vector<Satyricon::Literal,_std::allocator<Satyricon::Literal>_>::reserve
            (this_00,(long)(this->map_position).super__Vector_base<int,_std::allocator<int>_>.
                           _M_impl.super__Vector_impl_data._M_finish -
                     (long)(this->map_position).super__Vector_base<int,_std::allocator<int>_>.
                           _M_impl.super__Vector_impl_data._M_start >> 2);
  iVar6._M_current =
       (this->value).super__Vector_base<Satyricon::Literal,_std::allocator<Satyricon::Literal>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  piVar1 = (this->map_position).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar7 = (long)(this->map_position).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish - (long)piVar1 >> 2;
  if ((int)(uVar7 >> 1) < 1) {
    uVar3 = (long)iVar6._M_current -
            (long)(this_00->
                  super__Vector_base<Satyricon::Literal,_std::allocator<Satyricon::Literal>_>).
                  _M_impl.super__Vector_impl_data._M_start;
  }
  else {
    uVar8 = 0;
    iVar5 = 0;
    do {
      pLVar2 = (this->value).
               super__Vector_base<Satyricon::Literal,_std::allocator<Satyricon::Literal>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
      uStack_38._4_4_ = uVar8;
      if (iVar6._M_current == pLVar2) {
        std::vector<Satyricon::Literal,std::allocator<Satyricon::Literal>>::
        _M_realloc_insert<Satyricon::Literal_const&>
                  ((vector<Satyricon::Literal,std::allocator<Satyricon::Literal>> *)this_00,iVar6,
                   (Literal *)((long)&uStack_38 + 4));
        iVar6._M_current =
             (this->value).
             super__Vector_base<Satyricon::Literal,_std::allocator<Satyricon::Literal>_>._M_impl.
             super__Vector_impl_data._M_finish;
        pLVar2 = (this->value).
                 super__Vector_base<Satyricon::Literal,_std::allocator<Satyricon::Literal>_>._M_impl
                 .super__Vector_impl_data._M_end_of_storage;
        piVar1 = (this->map_position).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
      }
      else {
        (iVar6._M_current)->value = uVar8;
        iVar6._M_current = iVar6._M_current + 1;
        (this->value).super__Vector_base<Satyricon::Literal,_std::allocator<Satyricon::Literal>_>.
        _M_impl.super__Vector_impl_data._M_finish = iVar6._M_current;
      }
      pLVar4 = (this_00->super__Vector_base<Satyricon::Literal,_std::allocator<Satyricon::Literal>_>
               )._M_impl.super__Vector_impl_data._M_start;
      piVar1[uStack_38._4_4_] = (int)((ulong)((long)iVar6._M_current - (long)pLVar4) >> 2) + -1;
      uStack_38 = CONCAT44(uVar8 + 1,(undefined4)uStack_38);
      if (iVar6._M_current == pLVar2) {
        std::vector<Satyricon::Literal,std::allocator<Satyricon::Literal>>::
        _M_realloc_insert<Satyricon::Literal_const&>
                  ((vector<Satyricon::Literal,std::allocator<Satyricon::Literal>> *)this_00,iVar6,
                   (Literal *)((long)&uStack_38 + 4));
        pLVar4 = (this->value).
                 super__Vector_base<Satyricon::Literal,_std::allocator<Satyricon::Literal>_>._M_impl
                 .super__Vector_impl_data._M_start;
        iVar6._M_current =
             (this->value).
             super__Vector_base<Satyricon::Literal,_std::allocator<Satyricon::Literal>_>._M_impl.
             super__Vector_impl_data._M_finish;
        piVar1 = (this->map_position).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
      }
      else {
        (iVar6._M_current)->value = uVar8 + 1;
        iVar6._M_current = iVar6._M_current + 1;
        (this->value).super__Vector_base<Satyricon::Literal,_std::allocator<Satyricon::Literal>_>.
        _M_impl.super__Vector_impl_data._M_finish = iVar6._M_current;
      }
      uVar3 = (long)iVar6._M_current - (long)pLVar4;
      piVar1[uStack_38 >> 0x20] = (int)(uVar3 >> 2) + -1;
      iVar5 = iVar5 + 1;
      uVar7 = (long)(this->map_position).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_finish - (long)piVar1 >> 2;
      uVar8 = uVar8 + 2;
    } while (iVar5 < (int)(uVar7 >> 1));
  }
  if ((long)uVar3 >> 2 != uVar7) {
    __assert_fail("value.size() == map_position.size()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/GiuMaz[P]satyricon/include/solver_types.hpp"
                  ,0xdf,"void Satyricon::Literal_Heap::initialize()");
  }
  if ((uVar7 >> 0x20 & 1) == 0) {
    i = uVar7 >> 1 & 0x7fffffff;
    do {
      heapify(this,i);
      bVar9 = i != 0;
      i = i - 1;
    } while (bVar9);
  }
  return;
}

Assistant:

void initialize() {
        value.clear();
        value.reserve(map_position.size());

        for ( int i = 0; i < static_cast<int>(map_position.size()/2); ++i ) {

            Literal l(i,false);
            value.push_back(l);
            map_position[l.index()] = value.size()-1;

            l = Literal(i,true);
            value.push_back(l);
            map_position[l.index()] = value.size()-1;

        }
        assert( value.size() == map_position.size());

        for ( int i = value.size()/2; i >= 0; --i )
            heapify(i);

    }